

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

GeneralMedium<pbrt::UniformGridMediumProvider> *
pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>::Create
          (UniformGridMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RGBColorSpace *pRVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  string preset;
  string local_c0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_a0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_98;
  Float local_90;
  Float local_8c;
  undefined1 local_88 [40];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_98.bits = 0;
  local_a0.bits = 0;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_88._32_8_ = renderFromMedium;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"preset","");
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  ParameterDictionary::GetOneString((string *)local_60,parameters,&local_c0,(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,
                    (ulong)((long)&(((string *)local_88._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_60._8_8_ != (ParsedParameter *)0x0) {
    bVar4 = GetMediumScatteringProperties
                      ((string *)local_60,(SpectrumHandle *)&local_98,(SpectrumHandle *)&local_a0,
                       alloc);
    if (!bVar4) {
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_c0,"Material preset \"%s\" not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      Warning(loc,local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((pointer)local_98.bits == (pointer)0x0) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sigma_a","");
    local_40._8_8_ = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_88,(string *)parameters,(SpectrumHandle *)&local_c0,
               (int)&local_40 + 8,(Allocator)0x1);
    uVar3 = local_88._0_8_;
    local_98.bits = local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    pRVar2 = RGBColorSpace::sRGB;
    if ((pointer)uVar3 == (pointer)0x0) {
      local_c0._M_dataplus._M_p = (pointer)0x3b1d49523a902de0;
      local_c0._M_string_length = CONCAT44(local_c0._M_string_length._4_4_,0x3c656042);
      iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      RGBSpectrum::RGBSpectrum((RGBSpectrum *)CONCAT44(extraout_var,iVar5),pRVar2,(RGB *)&local_c0);
      local_98.bits = CONCAT44(extraout_var,iVar5) | 0x4000000000000;
    }
  }
  if ((pointer)local_a0.bits == (pointer)0x0) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sigma_s","");
    local_40._M_allocated_capacity = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_88,(string *)parameters,(SpectrumHandle *)&local_c0,
               (SpectrumType)&local_40,(Allocator)0x1);
    uVar3 = local_88._0_8_;
    local_a0.bits = local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    pRVar2 = RGBColorSpace::sRGB;
    if ((pointer)uVar3 == (pointer)0x0) {
      local_c0._M_dataplus._M_p = (pointer)0x404d70a440233333;
      local_c0._M_string_length = CONCAT44(local_c0._M_string_length._4_4_,0x407147ae);
      iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)CONCAT44(extraout_var_00,iVar5),pRVar2,(RGB *)&local_c0);
      local_a0.bits = CONCAT44(extraout_var_00,iVar5) | 0x4000000000000;
    }
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
  local_8c = ParameterDictionary::GetOneFloat(parameters,&local_c0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"g","");
  local_90 = ParameterDictionary::GetOneFloat(parameters,&local_c0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x1a8,8);
  local_c0._M_dataplus._M_p = (pointer)local_98.bits;
  local_88._0_8_ = local_a0.bits;
  GeneralMedium((GeneralMedium<pbrt::UniformGridMediumProvider> *)CONCAT44(extraout_var_01,iVar5),
                provider,(SpectrumHandle *)&local_c0,(SpectrumHandle *)local_88,local_8c,local_90,
                (Transform *)local_88._32_8_,alloc);
  if ((ParsedParameter *)local_60._0_8_ != (ParsedParameter *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return (GeneralMedium<pbrt::UniformGridMediumProvider> *)CONCAT44(extraout_var_01,iVar5);
}

Assistant:

static GeneralMedium<DensityProvider> *Create(const DensityProvider *provider,
                                                  const ParameterDictionary &parameters,
                                                  const Transform &renderFromMedium,
                                                  const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(.0011f, .0024f, .014f));
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(2.55f, 3.21f, 3.77f));
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<GeneralMedium<DensityProvider>>(
            provider, sig_a, sig_s, sigScale, g, renderFromMedium, alloc);
    }